

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  
  uVar2 = (*this->_readf)(this->_up);
  if ((long)uVar2 < 0x100) {
    if (uVar2 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
      uVar2 = 0;
      goto LAB_0011a2e1;
    }
  }
  else {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  this->_currdata = (LexChar)uVar2;
LAB_0011a2e1:
  this->_currentcolumn = this->_currentcolumn + 1;
  uVar3 = (uint)uVar2 & 0xff;
  iVar1 = isxdigit(uVar3);
  if (iVar1 == 0) {
    (*this->_errfunc)(this->_errtarget,"hexadecimal number expected");
    uVar2 = (ulong)this->_currdata;
    uVar3 = (uint)this->_currdata;
  }
  iVar1 = isxdigit(uVar3);
  lVar4 = 0;
  if (0 < maxdigits && iVar1 != 0) {
    do {
      dest[lVar4] = (SQChar)uVar2;
      uVar2 = (*this->_readf)(this->_up);
      if ((long)uVar2 < 0x100) {
        if (uVar2 != 0) goto LAB_0011a360;
        this->_currdata = '\0';
        this->_reached_eof = 1;
        uVar2 = 0;
      }
      else {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
LAB_0011a360:
        this->_currdata = (LexChar)uVar2;
      }
      lVar4 = lVar4 + 1;
      this->_currentcolumn = this->_currentcolumn + 1;
      iVar1 = isxdigit((uint)uVar2 & 0xff);
    } while ((iVar1 != 0) && (lVar4 < maxdigits));
  }
  dest[lVar4] = '\0';
  return lVar4;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR)) Error(_SC("hexadecimal number expected"));
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}